

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

int aom_satd_lp_avx2(int16_t *coeff,int length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar4 [32];
  __m128i accum_128;
  __m256i d;
  __m256i c;
  __m256i b;
  __m256i a;
  __m256i sum;
  __m256i abs;
  __m256i src_line;
  int i;
  __m256i accum;
  __m256i one;
  int local_2e4;
  undefined1 local_2e0 [32];
  undefined1 (*local_290) [32];
  ulong uStack_278;
  int local_110;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  uStack_278 = SUB328(ZEXT832(0),4);
  local_2e0 = ZEXT832(uStack_278) << 0x40;
  local_290 = in_RDI;
  for (local_2e4 = 0; local_2e4 < in_ESI; local_2e4 = local_2e4 + 0x10) {
    auVar4 = vpabsw_avx2(*local_290);
    auVar3._16_8_ = uStack_70;
    auVar3._0_16_ = auVar1;
    auVar3._24_8_ = uStack_68;
    auVar4 = vpmaddwd_avx2(auVar4,auVar3);
    local_2e0 = vpaddd_avx2(local_2e0,auVar4);
    local_290 = local_290 + 1;
  }
  auVar4 = vpsrldq_avx2(local_2e0,8);
  auVar4 = vpaddd_avx2(local_2e0,auVar4);
  auVar3 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
  auVar4 = vpaddd_avx2(auVar4,auVar3);
  auVar1 = vpaddd_avx(auVar4._0_16_,auVar4._16_16_);
  local_110 = auVar1._0_4_;
  return local_110;
}

Assistant:

int aom_satd_lp_avx2(const int16_t *coeff, int length) {
  const __m256i one = _mm256_set1_epi16(1);
  __m256i accum = _mm256_setzero_si256();

  for (int i = 0; i < length; i += 16) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)coeff);
    const __m256i abs = _mm256_abs_epi16(src_line);
    const __m256i sum = _mm256_madd_epi16(abs, one);
    accum = _mm256_add_epi32(accum, sum);
    coeff += 16;
  }

  {  // 32 bit horizontal add
    const __m256i a = _mm256_srli_si256(accum, 8);
    const __m256i b = _mm256_add_epi32(accum, a);
    const __m256i c = _mm256_srli_epi64(b, 32);
    const __m256i d = _mm256_add_epi32(b, c);
    const __m128i accum_128 = _mm_add_epi32(_mm256_castsi256_si128(d),
                                            _mm256_extractf128_si256(d, 1));
    return _mm_cvtsi128_si32(accum_128);
  }
}